

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

void __thiscall MeCab::anon_unknown_0::LatticeImpl::clear(LatticeImpl *this)

{
  StringBuffer *pSVar1;
  pointer ppmVar2;
  pointer ppcVar3;
  pointer puVar4;
  void *in_RSI;
  
  Allocator<mecab_node_t,_mecab_path_t>::free((this->allocator_).ptr_,in_RSI);
  pSVar1 = (this->ostrs_).ptr_;
  if (pSVar1 != (StringBuffer *)0x0) {
    pSVar1->size_ = 0;
  }
  ppmVar2 = (this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppmVar2) {
    (this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppmVar2;
  }
  ppmVar2 = (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppmVar2) {
    (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppmVar2;
  }
  ppcVar3 = (this->feature_constraint_).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->feature_constraint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppcVar3) {
    (this->feature_constraint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppcVar3;
  }
  puVar4 = (this->boundary_constraint_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->boundary_constraint_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
    (this->boundary_constraint_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  this->theta_ = 0.75;
  this->Z_ = 0.0;
  this->sentence_ = (char *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

void LatticeImpl::clear() {
  allocator_->free();
  if (ostrs_.get()) {
    ostrs_->clear();
  }
  begin_nodes_.clear();
  end_nodes_.clear();
  feature_constraint_.clear();
  boundary_constraint_.clear();
  size_ = 0;
  theta_ = kDefaultTheta;
  Z_ = 0.0;
  sentence_ = 0;
}